

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItem
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          MessageSetFieldSkipper *field_skipper)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  uint32 uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  byte *pbVar9;
  ulong uVar10;
  byte unaff_BPL;
  uint uVar11;
  string message_data;
  string temp;
  CodedOutputStream coded_output;
  StringOutputStream output_stream;
  string local_d0;
  undefined1 local_b0 [28];
  undefined8 local_94;
  undefined2 local_8c;
  int local_88;
  undefined8 local_84;
  int local_7c;
  int local_78;
  bool local_74;
  DescriptorPool *local_70;
  MessageFactory *pMStack_68;
  CodedOutputStream local_60;
  StringOutputStream local_40;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  iVar8 = 0;
  do {
    pbVar9 = input->buffer_;
    uVar5 = 0;
    if (pbVar9 < input->buffer_end_) {
      bVar1 = *pbVar9;
      uVar7 = (ulong)bVar1;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_003156ae;
      input->buffer_ = pbVar9 + 1;
    }
    else {
LAB_003156ae:
      uVar5 = io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar7 = (ulong)uVar5;
    }
    iVar6 = (int)uVar7;
    if (iVar6 < 0x10) {
      if (iVar6 == 0) {
LAB_0031570c:
        unaff_BPL = 0;
      }
      else {
        if (iVar6 != 0xc) {
LAB_003156f6:
          iVar6 = (*(field_skipper->super_UnknownFieldSetFieldSkipper).super_FieldSkipper.
                    _vptr_FieldSkipper[2])(field_skipper,input,uVar7);
          cVar3 = (char)iVar6;
LAB_00315704:
          if (cVar3 == '\0') goto LAB_0031570c;
LAB_00315986:
          bVar4 = true;
          goto LAB_00315988;
        }
        unaff_BPL = 1;
      }
      bVar4 = false;
    }
    else if (iVar6 == 0x10) {
      pbVar9 = input->buffer_;
      if (pbVar9 < input->buffer_end_) {
        bVar1 = *pbVar9;
        uVar7 = (ulong)bVar1;
        uVar5 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0031577b;
        input->buffer_ = pbVar9 + 1;
        bVar4 = true;
      }
      else {
        uVar5 = 0;
LAB_0031577b:
        uVar7 = io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        bVar4 = -1 < (long)uVar7;
      }
      iVar6 = (int)uVar7;
      if (bVar4) {
        iVar8 = iVar6;
        if (local_d0._M_string_length == 0) {
          bVar4 = true;
        }
        else {
          local_b0._0_8_ = local_d0._M_dataplus._M_p;
          local_b0._24_4_ = (undefined4)local_d0._M_string_length;
          local_b0._8_8_ = local_d0._M_dataplus._M_p + (int)local_b0._24_4_;
          local_b0._16_8_ = (ZeroCopyInputStream *)0x0;
          local_94._0_4_ = 0;
          local_94._4_4_ = 0;
          local_8c._0_1_ = false;
          local_8c._1_1_ = false;
          local_84._0_4_ = 0;
          local_84._4_4_ = 0x7fffffff;
          local_7c = io::CodedInputStream::default_recursion_limit_;
          local_78 = io::CodedInputStream::default_recursion_limit_;
          local_74 = true;
          local_70 = (DescriptorPool *)0x0;
          pMStack_68 = (MessageFactory *)0x0;
          local_88 = local_b0._24_4_;
          bVar4 = ParseField(this,iVar6 * 8 + 2,(CodedInputStream *)local_b0,extension_finder,
                             (FieldSkipper *)field_skipper);
          if (bVar4) {
            local_d0._M_string_length = 0;
            *local_d0._M_dataplus._M_p = '\0';
          }
          else {
            unaff_BPL = 0;
          }
          io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_b0);
        }
      }
      else {
        unaff_BPL = 0;
        bVar4 = false;
      }
      if (bVar4 != false) goto LAB_00315986;
      bVar4 = false;
    }
    else {
      if (iVar6 != 0x1a) goto LAB_003156f6;
      if (iVar8 != 0) {
        cVar3 = ParseField(this,iVar8 * 8 + 2,input,extension_finder,(FieldSkipper *)field_skipper);
        goto LAB_00315704;
      }
      local_b0._0_8_ = local_b0 + 0x10;
      local_b0._8_8_ = (uint8 *)0x0;
      local_b0._16_8_ = local_b0._16_8_ & 0xffffffffffffff00;
      pbVar9 = input->buffer_;
      if (pbVar9 < input->buffer_end_) {
        bVar1 = *pbVar9;
        uVar7 = (ulong)bVar1;
        uVar5 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_00315876;
        input->buffer_ = pbVar9 + 1;
        bVar4 = true;
      }
      else {
        uVar5 = 0;
LAB_00315876:
        uVar7 = io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        bVar4 = -1 < (long)uVar7;
      }
      uVar11 = (uint)uVar7;
      if ((bVar4) &&
         (bVar4 = io::CodedInputStream::ReadString(input,(string *)local_b0,uVar11), bVar4)) {
        io::StringOutputStream::StringOutputStream(&local_40,&local_d0);
        io::CodedOutputStream::CodedOutputStream(&local_60,&local_40.super_ZeroCopyOutputStream);
        if (local_60.buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(&local_60,uVar11);
        }
        else {
          pbVar9 = local_60.buffer_;
          if (uVar11 < 0x80) {
            uVar10 = uVar7 & 0xffffffff;
          }
          else {
            uVar10 = uVar7 & 0xffffffff;
            do {
              uVar11 = (uint)uVar7;
              *pbVar9 = (byte)uVar7 | 0x80;
              uVar10 = uVar10 >> 7;
              pbVar9 = pbVar9 + 1;
              uVar7 = uVar10;
            } while (0x3fff < uVar11);
          }
          *pbVar9 = (byte)uVar10;
          iVar8 = ((int)pbVar9 - (int)local_60.buffer_) + 1;
          local_60.buffer_ = local_60.buffer_ + iVar8;
          local_60.buffer_size_ = local_60.buffer_size_ - iVar8;
        }
        io::CodedOutputStream::WriteRaw(&local_60,(void *)local_b0._0_8_,local_b0._8_4_);
        io::CodedOutputStream::~CodedOutputStream(&local_60);
        io::StringOutputStream::~StringOutputStream(&local_40);
        bVar2 = true;
      }
      else {
        unaff_BPL = 0;
        bVar2 = false;
      }
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
      }
      iVar8 = 0;
      bVar4 = false;
      if (bVar2) goto LAB_00315986;
    }
LAB_00315988:
    if (!bVar4) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool ExtensionSet::ParseMessageSetItem(io::CodedInputStream* input,
                                       ExtensionFinder* extension_finder,
                                       MessageSetFieldSkipper* field_skipper) {
  // TODO(kenton):  It would be nice to share code between this and
  // WireFormatLite::ParseAndMergeMessageSetItem(), but I think the
  // differences would be hard to factor out.

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  uint32 last_type_id = 0;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    const uint32 tag = input->ReadTagNoLastTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        last_type_id = type_id;

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::CodedInputStream sub_input(
              reinterpret_cast<const uint8*>(message_data.data()),
              message_data.size());
          if (!ParseFieldMaybeLazily(WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
                                     last_type_id, &sub_input,
                                     extension_finder, field_skipper)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (last_type_id == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseFieldMaybeLazily(WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
                                     last_type_id, input,
                                     extension_finder, field_skipper)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!field_skipper->SkipField(input, tag)) return false;
      }
    }
  }
}